

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

int mbedtls_gcm_self_test(int verbose)

{
  uchar (*input) [64];
  size_t length;
  size_t iv_len;
  size_t add_len;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar (*key) [32];
  uchar (*pauVar6) [16];
  ulong uVar7;
  uchar (*add) [64];
  uint keybits;
  uchar (*iv) [64];
  uchar (*input_00) [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uchar tag_buf [16];
  uchar buf [64];
  mbedtls_gcm_context ctx;
  
  memset(&ctx,0,0x1a0);
  lVar5 = 0;
  do {
    keybits = (int)lVar5 * 0x40 + 0x80;
    uVar7 = 0;
    do {
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",(ulong)keybits,uVar7 & 0xffffffff,"enc");
      }
      iVar2 = key_index[uVar7];
      key = ::key + iVar2;
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      length = pt_len[uVar7];
      iv = ::iv + iv_index[uVar7];
      iv_len = ::iv_len[uVar7];
      add = additional + add_index[uVar7];
      add_len = ::add_len[uVar7];
      input = pt + iVar2;
      iVar1 = mbedtls_gcm_crypt_and_tag
                        (&ctx,1,length,*iv,iv_len,*add,add_len,*input,buf,0x10,tag_buf);
      if (iVar1 != 0) {
LAB_0015813a:
        if (verbose != 0) {
          puts("failed");
          return 1;
        }
        return 1;
      }
      lVar4 = uVar7 + lVar5 * 6;
      input_00 = ct + lVar4;
      iVar1 = bcmp(buf,input_00,length);
      if ((iVar1 != 0) ||
         (auVar8[0] = -(tag[lVar4][0] == tag_buf[0]), auVar8[1] = -(tag[lVar4][1] == tag_buf[1]),
         auVar8[2] = -(tag[lVar4][2] == tag_buf[2]), auVar8[3] = -(tag[lVar4][3] == tag_buf[3]),
         auVar8[4] = -(tag[lVar4][4] == tag_buf[4]), auVar8[5] = -(tag[lVar4][5] == tag_buf[5]),
         auVar8[6] = -(tag[lVar4][6] == tag_buf[6]), auVar8[7] = -(tag[lVar4][7] == tag_buf[7]),
         auVar8[8] = -(tag[lVar4][8] == tag_buf[8]), auVar8[9] = -(tag[lVar4][9] == tag_buf[9]),
         auVar8[10] = -(tag[lVar4][10] == tag_buf[10]),
         auVar8[0xb] = -(tag[lVar4][0xb] == tag_buf[0xb]),
         auVar8[0xc] = -(tag[lVar4][0xc] == tag_buf[0xc]),
         auVar8[0xd] = -(tag[lVar4][0xd] == tag_buf[0xd]),
         auVar8[0xe] = -(tag[lVar4][0xe] == tag_buf[0xe]),
         auVar8[0xf] = -(tag[lVar4][0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
         != 0xffff)) goto LAB_0015813a;
      pauVar6 = tag + lVar4;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar3 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar3 + -0x20] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x1a0);
      if (verbose != 0) {
        puts("passed");
        printf("  AES-GCM-%3d #%d (%s): ",(ulong)keybits,uVar7 & 0xffffffff,"dec");
      }
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      iVar1 = mbedtls_gcm_crypt_and_tag
                        (&ctx,0,length,*iv,iv_len,*add,add_len,*input_00,buf,0x10,tag_buf);
      if (((iVar1 != 0) || (iVar1 = bcmp(buf,input,length), iVar1 != 0)) ||
         (auVar9[0] = -((*pauVar6)[0] == tag_buf[0]), auVar9[1] = -(tag[lVar4][1] == tag_buf[1]),
         auVar9[2] = -(tag[lVar4][2] == tag_buf[2]), auVar9[3] = -(tag[lVar4][3] == tag_buf[3]),
         auVar9[4] = -(tag[lVar4][4] == tag_buf[4]), auVar9[5] = -(tag[lVar4][5] == tag_buf[5]),
         auVar9[6] = -(tag[lVar4][6] == tag_buf[6]), auVar9[7] = -(tag[lVar4][7] == tag_buf[7]),
         auVar9[8] = -(tag[lVar4][8] == tag_buf[8]), auVar9[9] = -(tag[lVar4][9] == tag_buf[9]),
         auVar9[10] = -(tag[lVar4][10] == tag_buf[10]),
         auVar9[0xb] = -(tag[lVar4][0xb] == tag_buf[0xb]),
         auVar9[0xc] = -(tag[lVar4][0xc] == tag_buf[0xc]),
         auVar9[0xd] = -(tag[lVar4][0xd] == tag_buf[0xd]),
         auVar9[0xe] = -(tag[lVar4][0xe] == tag_buf[0xe]),
         auVar9[0xf] = -(tag[lVar4][0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
         != 0xffff)) goto LAB_0015813a;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar3 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar3 + -0x20] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x1a0);
      if (verbose != 0) {
        puts("passed");
        printf("  AES-GCM-%3d #%d split (%s): ",(ulong)keybits,uVar7 & 0xffffffff,"enc");
      }
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      iVar1 = mbedtls_gcm_starts(&ctx,1,*iv,iv_len,*add,add_len);
      if (iVar1 != 0) goto LAB_0015813a;
      if (uVar7 < 2) {
        iVar2 = mbedtls_gcm_update(&ctx,length,*input,buf);
      }
      else {
        iVar1 = mbedtls_gcm_update(&ctx,0x20,*input,buf);
        if (iVar1 != 0) goto LAB_0015813a;
        iVar2 = mbedtls_gcm_update(&ctx,length - 0x20,pt[iVar2] + 0x20,buf + 0x20);
      }
      if (((iVar2 != 0) || (iVar2 = mbedtls_gcm_finish(&ctx,tag_buf,0x10), iVar2 != 0)) ||
         ((iVar2 = bcmp(buf,input_00,length), iVar2 != 0 ||
          (auVar10[0] = -((*pauVar6)[0] == tag_buf[0]), auVar10[1] = -(tag[lVar4][1] == tag_buf[1]),
          auVar10[2] = -(tag[lVar4][2] == tag_buf[2]), auVar10[3] = -(tag[lVar4][3] == tag_buf[3]),
          auVar10[4] = -(tag[lVar4][4] == tag_buf[4]), auVar10[5] = -(tag[lVar4][5] == tag_buf[5]),
          auVar10[6] = -(tag[lVar4][6] == tag_buf[6]), auVar10[7] = -(tag[lVar4][7] == tag_buf[7]),
          auVar10[8] = -(tag[lVar4][8] == tag_buf[8]), auVar10[9] = -(tag[lVar4][9] == tag_buf[9]),
          auVar10[10] = -(tag[lVar4][10] == tag_buf[10]),
          auVar10[0xb] = -(tag[lVar4][0xb] == tag_buf[0xb]),
          auVar10[0xc] = -(tag[lVar4][0xc] == tag_buf[0xc]),
          auVar10[0xd] = -(tag[lVar4][0xd] == tag_buf[0xd]),
          auVar10[0xe] = -(tag[lVar4][0xe] == tag_buf[0xe]),
          auVar10[0xf] = -(tag[lVar4][0xf] == tag_buf[0xf]),
          (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff)))) goto LAB_0015813a;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar3 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar3 + -0x20] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x1a0);
      if (verbose != 0) {
        puts("passed");
        printf("  AES-GCM-%3d #%d split (%s): ",(ulong)keybits,uVar7,"dec");
      }
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      iVar2 = mbedtls_gcm_starts(&ctx,0,*iv,iv_len,*add,add_len);
      if (iVar2 != 0) goto LAB_0015813a;
      if (uVar7 < 2) {
        iVar2 = mbedtls_gcm_update(&ctx,length,*input_00,buf);
      }
      else {
        iVar2 = mbedtls_gcm_update(&ctx,0x20,*input_00,buf);
        if (iVar2 != 0) goto LAB_0015813a;
        iVar2 = mbedtls_gcm_update(&ctx,length - 0x20,ct[lVar4] + 0x20,buf + 0x20);
      }
      if (((iVar2 != 0) || (iVar2 = mbedtls_gcm_finish(&ctx,tag_buf,0x10), iVar2 != 0)) ||
         ((iVar2 = bcmp(buf,input,length), iVar2 != 0 ||
          (auVar11[0] = -((*pauVar6)[0] == tag_buf[0]), auVar11[1] = -(tag[lVar4][1] == tag_buf[1]),
          auVar11[2] = -(tag[lVar4][2] == tag_buf[2]), auVar11[3] = -(tag[lVar4][3] == tag_buf[3]),
          auVar11[4] = -(tag[lVar4][4] == tag_buf[4]), auVar11[5] = -(tag[lVar4][5] == tag_buf[5]),
          auVar11[6] = -(tag[lVar4][6] == tag_buf[6]), auVar11[7] = -(tag[lVar4][7] == tag_buf[7]),
          auVar11[8] = -(tag[lVar4][8] == tag_buf[8]), auVar11[9] = -(tag[lVar4][9] == tag_buf[9]),
          auVar11[10] = -(tag[lVar4][10] == tag_buf[10]),
          auVar11[0xb] = -(tag[lVar4][0xb] == tag_buf[0xb]),
          auVar11[0xc] = -(tag[lVar4][0xc] == tag_buf[0xc]),
          auVar11[0xd] = -(tag[lVar4][0xd] == tag_buf[0xd]),
          auVar11[0xe] = -(tag[lVar4][0xe] == tag_buf[0xe]),
          auVar11[0xf] = -(tag[lVar4][0xf] == tag_buf[0xf]),
          (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff)))) goto LAB_0015813a;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      lVar4 = 0;
      do {
        ctx.cipher_ctx.unprocessed_data[lVar4 + -0x20] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1a0);
      if (verbose != 0) {
        puts("passed");
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 6);
    lVar5 = lVar5 + 1;
    if (lVar5 == 3) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    mbedtls_gcm_init( &ctx );

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                 key_len, i, "enc" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                     pt_len[i],
                                     iv[iv_index[i]], iv_len[i],
                                     additional[add_index[i]], add_len[i],
                                     pt[pt_index[i]], buf, 16, tag_buf );

            if( ret != 0 ||
                memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                 key_len, i, "dec" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                     pt_len[i],
                                     iv[iv_index[i]], iv_len[i],
                                     additional[add_index[i]], add_len[i],
                                     ct[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 ||
                memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                 key_len, i, "enc" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, pt[pt_index[i]], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }

                ret = mbedtls_gcm_update( &ctx, rest_len, pt[pt_index[i]] + 32,
                                  buf + 32 );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], pt[pt_index[i]], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 ||
                memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                 key_len, i, "dec" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct[j * 6 + i], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }

                ret = mbedtls_gcm_update( &ctx, rest_len, ct[j * 6 + i] + 32,
                                  buf + 32 );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], ct[j * 6 + i], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 ||
                memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}